

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

LogMessage * __thiscall
google::protobuf::internal::LogMessage::operator<<(LogMessage *this,StringPiece *value)

{
  string local_38;
  StringPiece *local_18;
  StringPiece *value_local;
  LogMessage *this_local;
  
  local_18 = value;
  value_local = (StringPiece *)this;
  StringPiece::ToString_abi_cxx11_(&local_38,value);
  std::__cxx11::string::operator+=((string *)&this->message_,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

LogMessage& LogMessage::operator<<(const StringPiece& value) {
  message_ += value.ToString();
  return *this;
}